

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O1

int __thiscall deqp::gles3::Functional::BufferMapTests::init(BufferMapTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 dVar2;
  Context *pCVar3;
  _func_int **pp_Var4;
  TestNode *pTVar5;
  TestNode *pTVar6;
  BufferCase *pBVar7;
  char *pcVar8;
  long *plVar9;
  long *extraout_RAX;
  long *plVar10;
  long lVar11;
  deUint32 target;
  long lVar12;
  string name;
  allocator<char> local_b9;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  TestNode *local_78;
  long *local_70 [2];
  long local_60 [2];
  TestNode *local_50;
  TestNode *local_48;
  TestNode *local_40;
  TestNode *local_38;
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"read",
             "Buffer read using glMapBufferRange()");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar12 = 0;
  local_78 = (TestNode *)this;
  local_38 = pTVar5;
  do {
    pTVar5 = local_38;
    local_48 = (TestNode *)CONCAT44(local_48._4_4_,init::bufferDataSources[lVar12].write);
    local_40 = (TestNode *)lVar12;
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,
               init::bufferDataSources[lVar12].name,glcts::fixed_sample_locations_values + 1);
    local_50 = pTVar6;
    tcu::TestNode::addChild(pTVar5,pTVar6);
    lVar12 = 0;
    do {
      dVar1 = *(deUint32 *)((long)BufferCopyTests::init::bufferTargets + lVar12);
      pBVar7 = (BufferCase *)operator_new(0xd8);
      pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,pcVar8,(allocator<char> *)local_70);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_98 = &local_88;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_88 = *plVar10;
        lStack_80 = plVar9[3];
      }
      else {
        local_88 = *plVar10;
        local_98 = (long *)*plVar9;
      }
      local_90 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      deqp::gls::BufferTestUtil::BufferCase::BufferCase
                (pBVar7,pCVar3->m_testCtx,pCVar3->m_renderCtx,(char *)local_98,
                 glcts::fixed_sample_locations_values + 1);
      (pBVar7->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__BufferCase_0218e3b8;
      *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
      *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
           0x3fb000088e5;
      *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x3fb00000000;
      *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
           local_48._0_4_;
      tcu::TestNode::addChild(local_50,(TestNode *)pBVar7);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      pTVar5 = local_78;
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      pBVar7 = (BufferCase *)operator_new(0xd8);
      pCVar3 = (Context *)pTVar5[1]._vptr_TestNode;
      pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,pcVar8,(allocator<char> *)local_70);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_98 = &local_88;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_88 = *plVar10;
        lStack_80 = plVar9[3];
      }
      else {
        local_88 = *plVar10;
        local_98 = (long *)*plVar9;
      }
      local_90 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      deqp::gls::BufferTestUtil::BufferCase::BufferCase
                (pBVar7,pCVar3->m_testCtx,pCVar3->m_renderCtx,(char *)local_98,
                 glcts::fixed_sample_locations_values + 1);
      (pBVar7->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__BufferCase_0218e3b8;
      *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
      *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
           0x3fb000088e5;
      *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x1f500000011;
      *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
           local_48._0_4_;
      tcu::TestNode::addChild(local_50,(TestNode *)pBVar7);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      this = (BufferMapTests *)local_78;
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      pTVar5 = local_38;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x20);
    lVar12 = (long)local_40 + 1;
  } while (local_40 == (TestNode *)0x0);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,"usage_hints",
             "Different usage hints with glMapBufferRange()");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  lVar12 = 0;
  do {
    dVar1 = BufferCopyTests::init::bufferTargets[lVar12];
    lVar11 = 0;
    local_50 = (TestNode *)lVar12;
    do {
      dVar2 = *(deUint32 *)((long)init::usageHints + lVar11);
      pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar8,&local_b9);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_70);
      local_b8 = &local_a8;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar9[3];
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar9;
      }
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      deqp::gls::BufferTestUtil::getUsageHintName(dVar2);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_98 = &local_88;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_88 = *plVar10;
        lStack_80 = plVar9[3];
      }
      else {
        local_88 = *plVar10;
        local_98 = (long *)*plVar9;
      }
      local_90 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      pBVar7 = (BufferCase *)operator_new(0xd8);
      deqp::gls::BufferTestUtil::BufferCase::BufferCase
                (pBVar7,((Context *)local_78[1]._vptr_TestNode)->m_testCtx,
                 ((Context *)local_78[1]._vptr_TestNode)->m_renderCtx,(char *)local_98,
                 glcts::fixed_sample_locations_values + 1);
      (pBVar7->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__BufferCase_0218e3b8;
      *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
      *(deUint32 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = dVar2;
      pBVar7[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x3fb;
      pBVar7[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x3fb;
      tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x24);
    lVar12 = (long)local_50 + 1;
  } while (lVar12 != 8);
  pTVar6 = (TestNode *)operator_new(0x70);
  pTVar5 = local_78;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_78->m_testCtx,"write",
             "Buffer write using glMapBufferRange()");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  lVar12 = 0;
  local_48 = pTVar6;
  do {
    pTVar5 = local_48;
    local_50 = (TestNode *)CONCAT44(local_50._4_4_,init::bufferUses[lVar12].verify);
    local_40 = (TestNode *)lVar12;
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,local_78->m_testCtx,init::bufferUses[lVar12].name,
               glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(pTVar5,pTVar6);
    lVar12 = 0;
    do {
      dVar1 = *(deUint32 *)((long)BufferCopyTests::init::bufferTargets + lVar12);
      pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar8,&local_b9);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_70);
      local_b8 = &local_a8;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar9[3];
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar9;
      }
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      deqp::gls::BufferTestUtil::getUsageHintName(0x88e4);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_98 = &local_88;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_88 = *plVar10;
        lStack_80 = plVar9[3];
      }
      else {
        local_88 = *plVar10;
        local_98 = (long *)*plVar9;
      }
      local_90 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      pBVar7 = (BufferCase *)operator_new(0xd0);
      pp_Var4 = local_78[1]._vptr_TestNode;
      pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar8,&local_b9);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_70);
      local_b8 = &local_a8;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar9[3];
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar9;
      }
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      deqp::gls::BufferTestUtil::BufferCase::BufferCase
                (pBVar7,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],(char *)local_b8,
                 glcts::fixed_sample_locations_values + 1);
      (pBVar7->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__BufferCase_0218e408;
      *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
      *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
           0x3fb000088e4;
      *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx + 4) = local_50._0_4_
      ;
      tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      pBVar7 = (BufferCase *)operator_new(0xd8);
      pp_Var4 = local_78[1]._vptr_TestNode;
      pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar8,&local_b9);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_70);
      local_b8 = &local_a8;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar9[3];
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar9;
      }
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      deqp::gls::BufferTestUtil::BufferCase::BufferCase
                (pBVar7,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],(char *)local_b8,
                 glcts::fixed_sample_locations_values + 1);
      (pBVar7->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__BufferCase_0218e458;
      *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
      *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
           0x3fb000088e4;
      *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x1f500000011;
      *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
           local_50._0_4_;
      tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      pTVar5 = local_48;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x20);
    lVar12 = (long)local_40 + 1;
  } while (lVar12 != 3);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_78->m_testCtx,"usage_hints","Usage hints");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  lVar12 = 0;
  do {
    dVar1 = BufferCopyTests::init::bufferTargets[lVar12];
    lVar11 = 0;
    local_50 = (TestNode *)lVar12;
    do {
      dVar2 = *(deUint32 *)((long)init::usageHints + lVar11);
      pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar8,&local_b9);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_70);
      local_b8 = &local_a8;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar9[3];
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar9;
      }
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      deqp::gls::BufferTestUtil::getUsageHintName(dVar2);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_98 = &local_88;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_88 = *plVar10;
        lStack_80 = plVar9[3];
      }
      else {
        local_88 = *plVar10;
        local_98 = (long *)*plVar9;
      }
      local_90 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      pBVar7 = (BufferCase *)operator_new(0xd0);
      deqp::gls::BufferTestUtil::BufferCase::BufferCase
                (pBVar7,(TestContext *)*local_78[1]._vptr_TestNode,
                 (RenderContext *)local_78[1]._vptr_TestNode[1],(char *)local_98,
                 glcts::fixed_sample_locations_values + 1);
      (pBVar7->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__BufferCase_0218e408;
      *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
      *(deUint32 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = dVar2;
      pBVar7[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x3fb;
      tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x24);
    lVar12 = (long)local_50 + 1;
  } while (lVar12 != 8);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,local_78->m_testCtx,"invalidate","Buffer invalidate");
  tcu::TestNode::addChild(local_48,pTVar5);
  lVar12 = 0;
  do {
    dVar1 = *(deUint32 *)((long)BufferCopyTests::init::bufferTargets + lVar12);
    pBVar7 = (BufferCase *)operator_new(0xd0);
    pp_Var4 = local_78[1]._vptr_TestNode;
    pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,pcVar8,(allocator<char> *)local_70);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_98 = &local_88;
    plVar10 = plVar9 + 2;
    if ((long *)*plVar9 == plVar10) {
      local_88 = *plVar10;
      lStack_80 = plVar9[3];
    }
    else {
      local_88 = *plVar10;
      local_98 = (long *)*plVar9;
    }
    local_90 = plVar9[1];
    *plVar9 = (long)plVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    deqp::gls::BufferTestUtil::BufferCase::BufferCase
              (pBVar7,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],(char *)local_98,
               glcts::fixed_sample_locations_values + 1);
    (pBVar7->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BufferCase_0218e4a8
    ;
    *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0x88e4;
    *(undefined1 *)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx = 0;
    *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar7);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    pBVar7 = (BufferCase *)operator_new(0xd0);
    pp_Var4 = local_78[1]._vptr_TestNode;
    pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,pcVar8,(allocator<char> *)local_70);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_98 = &local_88;
    plVar10 = plVar9 + 2;
    if ((long *)*plVar9 == plVar10) {
      local_88 = *plVar10;
      lStack_80 = plVar9[3];
    }
    else {
      local_88 = *plVar10;
      local_98 = (long *)*plVar9;
    }
    local_90 = plVar9[1];
    *plVar9 = (long)plVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    deqp::gls::BufferTestUtil::BufferCase::BufferCase
              (pBVar7,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],(char *)local_98,
               glcts::fixed_sample_locations_values + 1);
    (pBVar7->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BufferCase_0218e4a8
    ;
    *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0x88e4;
    *(undefined1 *)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx = 1;
    *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar7);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    pTVar6 = local_48;
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x20);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,local_78->m_testCtx,"partial_invalidate","Partial invalidate");
  tcu::TestNode::addChild(pTVar6,pTVar5);
  lVar12 = 0;
  do {
    dVar1 = *(deUint32 *)((long)BufferCopyTests::init::bufferTargets + lVar12);
    pBVar7 = (BufferCase *)operator_new(0xd0);
    pp_Var4 = local_78[1]._vptr_TestNode;
    pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,pcVar8,(allocator<char> *)local_70);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_98 = &local_88;
    plVar10 = plVar9 + 2;
    if ((long *)*plVar9 == plVar10) {
      local_88 = *plVar10;
      lStack_80 = plVar9[3];
    }
    else {
      local_88 = *plVar10;
      local_98 = (long *)*plVar9;
    }
    local_90 = plVar9[1];
    *plVar9 = (long)plVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    deqp::gls::BufferTestUtil::BufferCase::BufferCase
              (pBVar7,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],(char *)local_98,
               glcts::fixed_sample_locations_values + 1);
    (pBVar7->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BufferCase_0218e4f8
    ;
    *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0x88e4;
    *(undefined1 *)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx = 0;
    *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar7);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    pBVar7 = (BufferCase *)operator_new(0xd0);
    pp_Var4 = local_78[1]._vptr_TestNode;
    pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,pcVar8,(allocator<char> *)local_70);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_98 = &local_88;
    plVar10 = plVar9 + 2;
    if ((long *)*plVar9 == plVar10) {
      local_88 = *plVar10;
      lStack_80 = plVar9[3];
    }
    else {
      local_88 = *plVar10;
      local_98 = (long *)*plVar9;
    }
    local_90 = plVar9[1];
    *plVar9 = (long)plVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    deqp::gls::BufferTestUtil::BufferCase::BufferCase
              (pBVar7,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],(char *)local_98,
               glcts::fixed_sample_locations_values + 1);
    (pBVar7->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BufferCase_0218e4f8
    ;
    *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0x88e4;
    *(undefined1 *)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx = 1;
    *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar7);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    pTVar6 = local_48;
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x20);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,local_78->m_testCtx,"explicit_flush","Explicit flush");
  tcu::TestNode::addChild(pTVar6,pTVar5);
  lVar12 = 0;
  do {
    dVar1 = *(deUint32 *)((long)BufferCopyTests::init::bufferTargets + lVar12);
    pBVar7 = (BufferCase *)operator_new(0xd0);
    pp_Var4 = local_78[1]._vptr_TestNode;
    pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,pcVar8,(allocator<char> *)local_70);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_98 = &local_88;
    plVar10 = plVar9 + 2;
    if ((long *)*plVar9 == plVar10) {
      local_88 = *plVar10;
      lStack_80 = plVar9[3];
    }
    else {
      local_88 = *plVar10;
      local_98 = (long *)*plVar9;
    }
    local_90 = plVar9[1];
    *plVar9 = (long)plVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    deqp::gls::BufferTestUtil::BufferCase::BufferCase
              (pBVar7,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],(char *)local_98,
               glcts::fixed_sample_locations_values + 1);
    (pBVar7->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BufferCase_0218e548
    ;
    *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0x88e4;
    *(undefined1 *)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx = 0;
    *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar7);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    pBVar7 = (BufferCase *)operator_new(0xd0);
    pp_Var4 = local_78[1]._vptr_TestNode;
    pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,pcVar8,(allocator<char> *)local_70);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_98 = &local_88;
    plVar10 = plVar9 + 2;
    if ((long *)*plVar9 == plVar10) {
      local_88 = *plVar10;
      lStack_80 = plVar9[3];
    }
    else {
      local_88 = *plVar10;
      local_98 = (long *)*plVar9;
    }
    local_90 = plVar9[1];
    *plVar9 = (long)plVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    deqp::gls::BufferTestUtil::BufferCase::BufferCase
              (pBVar7,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],(char *)local_98,
               glcts::fixed_sample_locations_values + 1);
    (pBVar7->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BufferCase_0218e548
    ;
    *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0x88e4;
    *(undefined1 *)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx = 1;
    *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar7);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    pTVar6 = local_48;
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x20);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,local_78->m_testCtx,"unsynchronized","Unsynchronized map");
  tcu::TestNode::addChild(pTVar6,pTVar5);
  lVar12 = 0;
  do {
    dVar1 = *(deUint32 *)((long)BufferCopyTests::init::bufferTargets + lVar12);
    pBVar7 = (BufferCase *)operator_new(200);
    pp_Var4 = local_78[1]._vptr_TestNode;
    pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
    deqp::gls::BufferTestUtil::BufferCase::BufferCase
              (pBVar7,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],pcVar8,
               glcts::fixed_sample_locations_values + 1);
    (pBVar7->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BufferCase_0218e598
    ;
    *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0x88e4;
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar7);
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x20);
  pTVar6 = (TestNode *)operator_new(0x70);
  pTVar5 = local_78;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_78->m_testCtx,"read_write",
             "Buffer read and write using glMapBufferRange()");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  lVar12 = 0;
  local_40 = pTVar6;
  do {
    pTVar5 = local_40;
    local_50 = (TestNode *)CONCAT44(local_50._4_4_,init::bufferUses[lVar12].verify);
    local_48 = (TestNode *)lVar12;
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,local_78->m_testCtx,init::bufferUses[lVar12].name,
               glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(pTVar5,pTVar6);
    lVar12 = 0;
    do {
      dVar1 = *(deUint32 *)((long)BufferCopyTests::init::bufferTargets + lVar12);
      pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar8,&local_b9);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_70);
      local_b8 = &local_a8;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar9[3];
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar9;
      }
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      deqp::gls::BufferTestUtil::getUsageHintName(0x88e4);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_98 = &local_88;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_88 = *plVar10;
        lStack_80 = plVar9[3];
      }
      else {
        local_88 = *plVar10;
        local_98 = (long *)*plVar9;
      }
      local_90 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      pBVar7 = (BufferCase *)operator_new(0xd8);
      pp_Var4 = local_78[1]._vptr_TestNode;
      pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar8,&local_b9);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_70);
      local_b8 = &local_a8;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar9[3];
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar9;
      }
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      deqp::gls::BufferTestUtil::BufferCase::BufferCase
                (pBVar7,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],(char *)local_b8,
                 glcts::fixed_sample_locations_values + 1);
      (pBVar7->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__BufferCase_0218e5e8;
      *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
      *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
           0x3fb000088e4;
      *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x3fb00000000;
      *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
           local_50._0_4_;
      tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      pBVar7 = (BufferCase *)operator_new(0xd8);
      pp_Var4 = local_78[1]._vptr_TestNode;
      pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar8,&local_b9);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_70);
      local_b8 = &local_a8;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar9[3];
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar9;
      }
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      deqp::gls::BufferTestUtil::BufferCase::BufferCase
                (pBVar7,(TestContext *)*pp_Var4,(RenderContext *)pp_Var4[1],(char *)local_b8,
                 glcts::fixed_sample_locations_values + 1);
      (pBVar7->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__BufferCase_0218e5e8;
      *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
      *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
           0x3fb000088e4;
      *(undefined8 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x1f500000011;
      *(undefined4 *)((long)&pBVar7[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
           local_50._0_4_;
      tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      pTVar5 = local_40;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x20);
    lVar12 = (long)local_48 + 1;
  } while (lVar12 != 3);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_78->m_testCtx,"usage_hints","Usage hints");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  local_50 = (TestNode *)0x0;
  do {
    dVar1 = BufferCopyTests::init::bufferTargets[(long)local_50];
    lVar12 = 0;
    do {
      dVar2 = *(deUint32 *)((long)init::usageHints + lVar12);
      pcVar8 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar8,&local_b9);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_70);
      local_b8 = &local_a8;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar9[3];
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar9;
      }
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      deqp::gls::BufferTestUtil::getUsageHintName(dVar2);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_98 = &local_88;
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_88 = *plVar10;
        lStack_80 = plVar9[3];
      }
      else {
        local_88 = *plVar10;
        local_98 = (long *)*plVar9;
      }
      local_90 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      pBVar7 = (BufferCase *)operator_new(0xd8);
      deqp::gls::BufferTestUtil::BufferCase::BufferCase
                (pBVar7,(TestContext *)*local_78[1]._vptr_TestNode,
                 (RenderContext *)local_78[1]._vptr_TestNode[1],(char *)local_98,
                 glcts::fixed_sample_locations_values + 1);
      (pBVar7->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__BufferCase_0218e5e8;
      *(deUint32 *)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
      *(deUint32 *)((long)&pBVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = dVar2;
      pBVar7[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x3fb;
      pBVar7[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x3fb;
      tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
      plVar9 = &local_88;
      if (local_98 != plVar9) {
        operator_delete(local_98,local_88 + 1);
        plVar9 = extraout_RAX;
      }
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x24);
    local_50 = (TestNode *)((long)local_50 + 1);
  } while (local_50 != (TestNode *)0x8);
  return (int)plVar9;
}

Assistant:

void BufferMapTests::init (void)
{
	static const deUint32 bufferTargets[] =
	{
		GL_ARRAY_BUFFER,
		GL_COPY_READ_BUFFER,
		GL_COPY_WRITE_BUFFER,
		GL_ELEMENT_ARRAY_BUFFER,
		GL_PIXEL_PACK_BUFFER,
		GL_PIXEL_UNPACK_BUFFER,
		GL_TRANSFORM_FEEDBACK_BUFFER,
		GL_UNIFORM_BUFFER
	};

	static const deUint32 usageHints[] =
	{
		GL_STREAM_DRAW,
		GL_STREAM_READ,
		GL_STREAM_COPY,
		GL_STATIC_DRAW,
		GL_STATIC_READ,
		GL_STATIC_COPY,
		GL_DYNAMIC_DRAW,
		GL_DYNAMIC_READ,
		GL_DYNAMIC_COPY
	};

	static const struct
	{
		const char*		name;
		WriteType		write;
	} bufferDataSources[] =
	{
		{ "sub_data",		WRITE_BUFFER_SUB_DATA	},
		{ "map_write",		WRITE_BUFFER_WRITE_MAP	}
	};

	static const struct
	{
		const char*		name;
		VerifyType		verify;
	} bufferUses[] =
	{
		{ "map_read",				VERIFY_BUFFER_READ_MAP	},
		{ "render_as_vertex_array",	VERIFY_AS_VERTEX_ARRAY	},
		{ "render_as_index_array",	VERIFY_AS_INDEX_ARRAY	}
	};

	// .read
	{
		tcu::TestCaseGroup* mapReadGroup = new tcu::TestCaseGroup(m_testCtx, "read", "Buffer read using glMapBufferRange()");
		addChild(mapReadGroup);

		// .[data src]
		for (int srcNdx = 0; srcNdx < DE_LENGTH_OF_ARRAY(bufferDataSources); srcNdx++)
		{
			WriteType			write		= bufferDataSources[srcNdx].write;
			tcu::TestCaseGroup* writeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferDataSources[srcNdx].name, "");
			mapReadGroup->addChild(writeGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				const deUint32	hint		= GL_STATIC_READ;
				const int		size		= 1019;
				const int		partialOffs	= 17;
				const int		partialSize	= 501;

				writeGroup->addChild(new BufferMapReadCase(m_context, (string(getBufferTargetName(target)) + "_full").c_str(),		"", target, hint, size, 0, size, write));
				writeGroup->addChild(new BufferMapReadCase(m_context, (string(getBufferTargetName(target)) + "_partial").c_str(),	"", target, hint, size, partialOffs, partialSize, write));
			}
		}

		// .usage_hints
		{
			tcu::TestCaseGroup* hintsGroup = new tcu::TestCaseGroup(m_testCtx, "usage_hints", "Different usage hints with glMapBufferRange()");
			mapReadGroup->addChild(hintsGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				for (int hintNdx = 0; hintNdx < DE_LENGTH_OF_ARRAY(usageHints); hintNdx++)
				{
					deUint32		target		= bufferTargets[targetNdx];
					deUint32		hint		= usageHints[hintNdx];
					const int		size		= 1019;
					string			name		= string(getBufferTargetName(target)) + "_" + getUsageHintName(hint);

					hintsGroup->addChild(new BufferMapReadCase(m_context, name.c_str(), "", target, hint, size, 0, size, WRITE_BUFFER_SUB_DATA));
				}
			}
		}
	}

	// .write
	{
		tcu::TestCaseGroup* mapWriteGroup = new tcu::TestCaseGroup(m_testCtx, "write", "Buffer write using glMapBufferRange()");
		addChild(mapWriteGroup);

		// .[verify type]
		for (int useNdx = 0; useNdx < DE_LENGTH_OF_ARRAY(bufferUses); useNdx++)
		{
			VerifyType			verify		= bufferUses[useNdx].verify;
			tcu::TestCaseGroup* useGroup	= new tcu::TestCaseGroup(m_testCtx, bufferUses[useNdx].name, "");
			mapWriteGroup->addChild(useGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;
				const int		size		= 1019;
				const int		partialOffs	= 17;
				const int		partialSize	= 501;
				string			name		= string(getBufferTargetName(target)) + "_" + getUsageHintName(hint);

				useGroup->addChild(new BufferMapWriteCase			(m_context, (string(getBufferTargetName(target)) + "_full").c_str(),	"", target, hint, size, verify));
				useGroup->addChild(new BufferPartialMapWriteCase	(m_context, (string(getBufferTargetName(target)) + "_partial").c_str(),	"", target, hint, size, partialOffs, partialSize, verify));
			}
		}

		// .usage_hints
		{
			tcu::TestCaseGroup* hintsGroup = new tcu::TestCaseGroup(m_testCtx, "usage_hints", "Usage hints");
			mapWriteGroup->addChild(hintsGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				for (int hintNdx = 0; hintNdx < DE_LENGTH_OF_ARRAY(usageHints); hintNdx++)
				{
					deUint32		target		= bufferTargets[targetNdx];
					deUint32		hint		= usageHints[hintNdx];
					const int		size		= 1019;
					string			name		= string(getBufferTargetName(target)) + "_" + getUsageHintName(hint);

					hintsGroup->addChild(new BufferMapWriteCase(m_context, name.c_str(), "", target, hint, size, VERIFY_AS_VERTEX_ARRAY));
				}
			}
		}

		// .invalidate
		{
			tcu::TestCaseGroup* invalidateGroup = new tcu::TestCaseGroup(m_testCtx, "invalidate", "Buffer invalidate");
			mapWriteGroup->addChild(invalidateGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;

				invalidateGroup->addChild(new BufferMapInvalidateCase(m_context, (string(getBufferTargetName(target)) + "_write_all").c_str(),		"", target, hint, false,	VERIFY_AS_VERTEX_ARRAY));
				invalidateGroup->addChild(new BufferMapInvalidateCase(m_context, (string(getBufferTargetName(target)) + "_write_partial").c_str(),	"", target, hint, true,		VERIFY_AS_VERTEX_ARRAY));
			}
		}

		// .partial_invalidate
		{
			tcu::TestCaseGroup* invalidateGroup = new tcu::TestCaseGroup(m_testCtx, "partial_invalidate", "Partial invalidate");
			mapWriteGroup->addChild(invalidateGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;

				invalidateGroup->addChild(new BufferMapPartialInvalidateCase(m_context, (string(getBufferTargetName(target)) + "_write_all").c_str(),		"", target, hint, false,	VERIFY_AS_VERTEX_ARRAY));
				invalidateGroup->addChild(new BufferMapPartialInvalidateCase(m_context, (string(getBufferTargetName(target)) + "_write_partial").c_str(),	"", target, hint, true,		VERIFY_AS_VERTEX_ARRAY));
			}
		}

		// .explicit_flush
		{
			tcu::TestCaseGroup* flushGroup = new tcu::TestCaseGroup(m_testCtx, "explicit_flush", "Explicit flush");
			mapWriteGroup->addChild(flushGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;

				flushGroup->addChild(new BufferMapExplicitFlushCase(m_context, (string(getBufferTargetName(target)) + "_all").c_str(),		"", target, hint, false,	VERIFY_AS_VERTEX_ARRAY));
				flushGroup->addChild(new BufferMapExplicitFlushCase(m_context, (string(getBufferTargetName(target)) + "_partial").c_str(),	"", target, hint, true,		VERIFY_AS_VERTEX_ARRAY));
			}
		}

		// .unsynchronized
		{
			tcu::TestCaseGroup* unsyncGroup = new tcu::TestCaseGroup(m_testCtx, "unsynchronized", "Unsynchronized map");
			mapWriteGroup->addChild(unsyncGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;

				unsyncGroup->addChild(new BufferMapUnsyncWriteCase(m_context, getBufferTargetName(target),	"", target, hint));
			}
		}
	}

	// .read_write
	{
		tcu::TestCaseGroup* mapReadWriteGroup = new tcu::TestCaseGroup(m_testCtx, "read_write", "Buffer read and write using glMapBufferRange()");
		addChild(mapReadWriteGroup);

		// .[verify type]
		for (int useNdx = 0; useNdx < DE_LENGTH_OF_ARRAY(bufferUses); useNdx++)
		{
			VerifyType			verify		= bufferUses[useNdx].verify;
			tcu::TestCaseGroup* useGroup	= new tcu::TestCaseGroup(m_testCtx, bufferUses[useNdx].name, "");
			mapReadWriteGroup->addChild(useGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;
				const int		size		= 1019;
				const int		partialOffs	= 17;
				const int		partialSize	= 501;
				string			name		= string(getBufferTargetName(target)) + "_" + getUsageHintName(hint);

				useGroup->addChild(new BufferMapReadWriteCase(m_context, (string(getBufferTargetName(target)) + "_full").c_str(),		"", target, hint, size, 0, size, verify));
				useGroup->addChild(new BufferMapReadWriteCase(m_context, (string(getBufferTargetName(target)) + "_partial").c_str(),	"", target, hint, size, partialOffs, partialSize, verify));
			}
		}

		// .usage_hints
		{
			tcu::TestCaseGroup* hintsGroup = new tcu::TestCaseGroup(m_testCtx, "usage_hints", "Usage hints");
			mapReadWriteGroup->addChild(hintsGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				for (int hintNdx = 0; hintNdx < DE_LENGTH_OF_ARRAY(usageHints); hintNdx++)
				{
					deUint32		target		= bufferTargets[targetNdx];
					deUint32		hint		= usageHints[hintNdx];
					const int		size		= 1019;
					string			name		= string(getBufferTargetName(target)) + "_" + getUsageHintName(hint);

					hintsGroup->addChild(new BufferMapReadWriteCase(m_context, name.c_str(), "", target, hint, size, 0, size, VERIFY_AS_VERTEX_ARRAY));
				}
			}
		}
	}
}